

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

Abc_Obj_t * Abc_NodeHasUniqueCoFanout(Abc_Obj_t *pNode)

{
  int iVar1;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pAVar2;
  char *__s1;
  char *__s2;
  int local_2c;
  Abc_Obj_t *pAStack_28;
  int i;
  Abc_Obj_t *pFanoutCo;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pNode_local;
  
  pAStack_28 = (Abc_Obj_t *)0x0;
  local_2c = 0;
  do {
    iVar1 = Abc_ObjFanoutNum(pNode);
    if (iVar1 <= local_2c) {
      return pAStack_28;
    }
    pObj = Abc_ObjFanout(pNode,local_2c);
    iVar1 = Abc_ObjIsCo(pObj);
    if ((iVar1 != 0) && (iVar1 = Abc_ObjFaninC0(pObj), iVar1 == 0)) {
      if (pAStack_28 == (Abc_Obj_t *)0x0) {
        iVar1 = Abc_ObjFaninNum(pObj);
        if (iVar1 != 1) {
          __assert_fail("Abc_ObjFaninNum(pFanout) == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                        ,0x364,"Abc_Obj_t *Abc_NodeHasUniqueCoFanout(Abc_Obj_t *)");
        }
        pAVar2 = Abc_ObjFanin0(pObj);
        pAStack_28 = pObj;
        if (pAVar2 != pNode) {
          __assert_fail("Abc_ObjFanin0(pFanout) == pNode",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                        ,0x365,"Abc_Obj_t *Abc_NodeHasUniqueCoFanout(Abc_Obj_t *)");
        }
      }
      else {
        __s1 = Abc_ObjName(pAStack_28);
        __s2 = Abc_ObjName(pObj);
        iVar1 = strcmp(__s1,__s2);
        if (iVar1 != 0) {
          return (Abc_Obj_t *)0x0;
        }
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

Abc_Obj_t * Abc_NodeHasUniqueCoFanout( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanout, * pFanoutCo;
    int i;
    pFanoutCo = NULL;
    Abc_ObjForEachFanout( pNode, pFanout, i )
    {
        if ( !Abc_ObjIsCo(pFanout) )
            continue;
        if ( Abc_ObjFaninC0(pFanout) )
            continue;
        if ( pFanoutCo == NULL )
        {
            assert( Abc_ObjFaninNum(pFanout) == 1 );
            assert( Abc_ObjFanin0(pFanout) == pNode );
            pFanoutCo = pFanout;
            continue;
        }
        if ( strcmp( Abc_ObjName(pFanoutCo), Abc_ObjName(pFanout) ) ) // they have diff names
            return NULL;
    }
    return pFanoutCo;
}